

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O0

FT_Error cff_subfont_load(CFF_SubFont subfont,CFF_Index idx,FT_UInt font_index,FT_Stream stream,
                         FT_ULong base_offset,FT_UInt code,CFF_Font_conflict font,CFF_Face face)

{
  void *pvVar1;
  FT_Driver pFVar2;
  FT_UInt FVar3;
  undefined4 uVar4;
  FT_Int32 FVar5;
  FT_Error FVar6;
  bool bVar7;
  bool bVar8;
  FT_Byte *local_d0;
  bool local_b9;
  PS_Driver driver;
  FT_UInt stackSize;
  FT_Bool cff2;
  PSAux_Service psaux;
  CFF_Private priv;
  CFF_FontRecDict top;
  FT_ULong dict_len;
  FT_Byte *dict;
  CFF_ParserRec parser;
  FT_Error error;
  FT_UInt code_local;
  FT_ULong base_offset_local;
  FT_Stream stream_local;
  FT_UInt font_index_local;
  CFF_Index idx_local;
  CFF_SubFont subfont_local;
  
  dict_len = 0;
  pvVar1 = face->psaux;
  bVar7 = code == 0x3000;
  bVar8 = code == 0x4000;
  local_b9 = bVar7 || bVar8;
  FVar3 = 0x60;
  if (bVar7 || bVar8) {
    FVar3 = 0x201;
  }
  parser._68_4_ = code;
  parser._64_4_ = cff_parser_init((CFF_Parser)&dict,code,subfont,font->library,FVar3,0,0);
  if (parser._64_4_ == 0) {
    memset(subfont,0,0x148);
    (subfont->font_dict).underline_position = -0x640000;
    (subfont->font_dict).underline_thickness = 0x320000;
    (subfont->font_dict).charstring_type = 2;
    (subfont->font_dict).font_matrix.xx = 0x10000;
    (subfont->font_dict).font_matrix.yy = 0x10000;
    (subfont->font_dict).cid_count = 0x2210;
    (subfont->font_dict).version = 0xffff;
    (subfont->font_dict).notice = 0xffff;
    (subfont->font_dict).copyright = 0xffff;
    (subfont->font_dict).full_name = 0xffff;
    (subfont->font_dict).family_name = 0xffff;
    (subfont->font_dict).weight = 0xffff;
    (subfont->font_dict).embedded_postscript = 0xffff;
    (subfont->font_dict).cid_registry = 0xffff;
    (subfont->font_dict).cid_ordering = 0xffff;
    (subfont->font_dict).cid_font_name = 0xffff;
    FVar3 = 0x30;
    if (bVar7 || bVar8) {
      FVar3 = 0x201;
    }
    (subfont->font_dict).maxstack = FVar3;
    if (idx->count == 0) {
      parser._64_4_ = FT_Stream_Seek(stream,idx->data_offset);
      if ((parser._64_4_ != 0) ||
         (parser._64_4_ = FT_Stream_ExtractFrame(stream,idx->data_size,(FT_Byte **)&dict_len),
         parser._64_4_ != 0)) goto LAB_002f61f8;
      top = (CFF_FontRecDict)idx->data_size;
    }
    else {
      parser._64_4_ =
           cff_index_access_element(idx,font_index,(FT_Byte **)&dict_len,(FT_ULong *)&top);
    }
    if (parser._64_4_ == 0) {
      if (dict_len == 0) {
        local_d0 = (FT_Byte *)0x0;
      }
      else {
        local_d0 = (FT_Byte *)((long)&top->version + dict_len);
      }
      parser._64_4_ = cff_parser_run((CFF_Parser)&dict,(FT_Byte *)dict_len,local_d0);
    }
    if (idx->count == 0) {
      FT_Stream_ReleaseFrame(stream,(FT_Byte **)&dict_len);
    }
    else {
      cff_index_forget_element(idx,(FT_Byte **)&dict_len);
    }
    if (((parser._64_4_ == 0) && ((subfont->font_dict).cid_registry == 0xffff)) &&
       (parser._64_4_ = cff_load_private_dict(font,subfont,0,(FT_Fixed *)0x0), parser._64_4_ == 0))
    {
      if (!bVar7 && !bVar8) {
        if (((face->root).internal)->random_seed == -1) {
          pFVar2 = (face->root).driver;
          subfont->random = *(FT_UInt32 *)&pFVar2[1].faces_list.tail;
          if (*(int *)&pFVar2[1].faces_list.tail != 0) {
            do {
              uVar4 = (**(code **)((long)pvVar1 + 0x28))(*(undefined4 *)&pFVar2[1].faces_list.tail);
              *(undefined4 *)&pFVar2[1].faces_list.tail = uVar4;
            } while (*(int *)&pFVar2[1].faces_list.tail < 0);
          }
        }
        else {
          subfont->random = ((face->root).internal)->random_seed;
          if (((face->root).internal)->random_seed != 0) {
            do {
              FVar5 = (**(code **)((long)pvVar1 + 0x28))(((face->root).internal)->random_seed);
              ((face->root).internal)->random_seed = FVar5;
            } while (((face->root).internal)->random_seed < 0);
          }
        }
        if (subfont->random == 0) {
          subfont->random = (FT_UInt32)(subfont->private_dict).initial_random_seed;
        }
      }
      if ((((subfont->private_dict).local_subrs_offset != 0) &&
          (parser._64_4_ =
                FT_Stream_Seek(stream,base_offset + (subfont->font_dict).private_offset +
                                      (subfont->private_dict).local_subrs_offset),
          parser._64_4_ == 0)) &&
         (parser._64_4_ = cff_index_init(&subfont->local_subrs_index,stream,'\x01',local_b9),
         parser._64_4_ == 0)) {
        parser._64_4_ =
             cff_index_get_pointers
                       (&subfont->local_subrs_index,&subfont->local_subrs,(FT_Byte **)0x0,
                        (FT_ULong *)0x0);
      }
    }
  }
LAB_002f61f8:
  cff_parser_done((CFF_Parser)&dict);
  FVar6._0_2_ = parser.num_designs;
  FVar6._2_2_ = parser.num_axes;
  return FVar6;
}

Assistant:

static FT_Error
  cff_subfont_load( CFF_SubFont  subfont,
                    CFF_Index    idx,
                    FT_UInt      font_index,
                    FT_Stream    stream,
                    FT_ULong     base_offset,
                    FT_UInt      code,
                    CFF_Font     font,
                    CFF_Face     face )
  {
    FT_Error         error;
    CFF_ParserRec    parser;
    FT_Byte*         dict = NULL;
    FT_ULong         dict_len;
    CFF_FontRecDict  top  = &subfont->font_dict;
    CFF_Private      priv = &subfont->private_dict;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;

    FT_Bool  cff2      = FT_BOOL( code == CFF2_CODE_TOPDICT  ||
                                  code == CFF2_CODE_FONTDICT );
    FT_UInt  stackSize = cff2 ? CFF2_DEFAULT_STACK
                              : CFF_MAX_STACK_DEPTH;


    /* Note: We use default stack size for CFF2 Font DICT because        */
    /*       Top and Font DICTs are not allowed to have blend operators. */
    error = cff_parser_init( &parser,
                             code,
                             &subfont->font_dict,
                             font->library,
                             stackSize,
                             0,
                             0 );
    if ( error )
      goto Exit;

    /* set defaults */
    FT_ZERO( top );

    top->underline_position  = -( 100L << 16 );
    top->underline_thickness = 50L << 16;
    top->charstring_type     = 2;
    top->font_matrix.xx      = 0x10000L;
    top->font_matrix.yy      = 0x10000L;
    top->cid_count           = 8720;

    /* we use the implementation specific SID value 0xFFFF to indicate */
    /* missing entries                                                 */
    top->version             = 0xFFFFU;
    top->notice              = 0xFFFFU;
    top->copyright           = 0xFFFFU;
    top->full_name           = 0xFFFFU;
    top->family_name         = 0xFFFFU;
    top->weight              = 0xFFFFU;
    top->embedded_postscript = 0xFFFFU;

    top->cid_registry        = 0xFFFFU;
    top->cid_ordering        = 0xFFFFU;
    top->cid_font_name       = 0xFFFFU;

    /* set default stack size */
    top->maxstack            = cff2 ? CFF2_DEFAULT_STACK : 48;

    if ( idx->count )   /* count is nonzero for a real index */
      error = cff_index_access_element( idx, font_index, &dict, &dict_len );
    else
    {
      /* CFF2 has a fake top dict index;     */
      /* simulate `cff_index_access_element' */

      /* Note: macros implicitly use `stream' and set `error' */
      if ( FT_STREAM_SEEK( idx->data_offset )       ||
           FT_FRAME_EXTRACT( idx->data_size, dict ) )
        goto Exit;

      dict_len = idx->data_size;
    }

    if ( !error )
    {
      FT_TRACE4(( " top dictionary:\n" ));
      error = cff_parser_run( &parser, dict, FT_OFFSET( dict, dict_len ) );
    }

    /* clean up regardless of error */
    if ( idx->count )
      cff_index_forget_element( idx, &dict );
    else
      FT_FRAME_RELEASE( dict );

    if ( error )
      goto Exit;

    /* if it is a CID font, we stop there */
    if ( top->cid_registry != 0xFFFFU )
      goto Exit;

    /* Parse the private dictionary, if any.                   */
    /*                                                         */
    /* CFF2 does not have a private dictionary in the Top DICT */
    /* but may have one in a Font DICT.  We need to parse      */
    /* the latter here in order to load any local subrs.       */
    error = cff_load_private_dict( font, subfont, 0, 0 );
    if ( error )
      goto Exit;

    if ( !cff2 )
    {
      /*
       * Initialize the random number generator.
       *
       * - If we have a face-specific seed, use it.
       *   If non-zero, update it to a positive value.
       *
       * - Otherwise, use the seed from the CFF driver.
       *   If non-zero, update it to a positive value.
       *
       * - If the random value is zero, use the seed given by the subfont's
       *   `initialRandomSeed' value.
       *
       */
      if ( face->root.internal->random_seed == -1 )
      {
        PS_Driver  driver = (PS_Driver)FT_FACE_DRIVER( face );


        subfont->random = (FT_UInt32)driver->random_seed;
        if ( driver->random_seed )
        {
          do
          {
            driver->random_seed =
              (FT_Int32)psaux->cff_random( (FT_UInt32)driver->random_seed );

          } while ( driver->random_seed < 0 );
        }
      }
      else
      {
        subfont->random = (FT_UInt32)face->root.internal->random_seed;
        if ( face->root.internal->random_seed )
        {
          do
          {
            face->root.internal->random_seed =
              (FT_Int32)psaux->cff_random(
                (FT_UInt32)face->root.internal->random_seed );

          } while ( face->root.internal->random_seed < 0 );
        }
      }

      if ( !subfont->random )
        subfont->random = (FT_UInt32)priv->initial_random_seed;
    }

    /* read the local subrs, if any */
    if ( priv->local_subrs_offset )
    {
      if ( FT_STREAM_SEEK( base_offset + top->private_offset +
                           priv->local_subrs_offset ) )
        goto Exit;

      error = cff_index_init( &subfont->local_subrs_index, stream, 1, cff2 );
      if ( error )
        goto Exit;

      error = cff_index_get_pointers( &subfont->local_subrs_index,
                                      &subfont->local_subrs, NULL, NULL );
      if ( error )
        goto Exit;
    }

  Exit:
    cff_parser_done( &parser ); /* free parser stack */

    return error;
  }